

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O1

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::d
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,int component,
          double d0,...)

{
  char in_AL;
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar3;
  Index *pIVar4;
  ulong uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  double extraout_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector V;
  va_list vl;
  double *local_108;
  undefined8 uStack_100;
  double local_f0;
  undefined8 local_e8;
  Index *local_e0;
  Index *local_d8;
  Index local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_88 = in_XMM1_Da;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_108 = (double *)0x0;
  uStack_100 = 0;
  local_f0 = d0;
  local_c8[2] = in_RDX;
  local_c8[3] = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  free((void *)0x0);
  pdVar1 = (double *)malloc(0x18);
  if (((ulong)pdVar1 & 0xf) == 0) {
    if (pdVar1 == (double *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::ios::widen;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uStack_100 = 3;
    *pdVar1 = local_f0;
    local_d8 = local_c8;
    local_e0 = &V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_e8 = 0x4000000010;
    lVar3 = 0;
    while( true ) {
      uVar5 = (ulong)local_e8._4_4_;
      if (uVar5 < 0xa1) {
        local_e8 = CONCAT44(local_e8._4_4_ + 0x10,(undefined4)local_e8);
        pIVar4 = (Index *)((long)local_d8 + uVar5);
      }
      else {
        pIVar4 = local_e0;
        local_e0 = local_e0 + 1;
      }
      local_108 = pdVar1;
      if (lVar3 == 2) break;
      pdVar1[lVar3 + 1] = (double)*pIVar4;
      lVar3 = lVar3 + 1;
      if (lVar3 == 2) {
        (*(this->super_function)._vptr_function[7])(this,component,&local_108);
        local_f0 = extraout_XMM0_Qa;
        free(local_108);
        return local_f0;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                "void *Eigen::internal::aligned_malloc(std::size_t)");
}

Assistant:

virtual const double d(int component, double d0, ...) const {
            va_list vl;
            vector V(N);
            V[0] = d0;

            va_start(vl, d0);
            for(unsigned int i = 1; i < N; i++) {
                V[i] = va_arg(vl, double);
            }
            va_end(vl);

            return d(component, V);
        }